

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O0

void dradbg(int ido,int ip,int l1,int idl1,float *cc,float *c1,float *c2,float *ch,float *ch2,
           float *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  int ipp2;
  float ar2h;
  float ar1h;
  float dsp;
  float arg;
  float dcp;
  int nbd;
  float ds2;
  float ar2;
  float ar1;
  float ai2;
  float ai1;
  float dc2;
  int t12;
  int t11;
  int t10;
  int t9;
  int t8;
  int t7;
  int t6;
  int t5;
  int t4;
  int t3;
  int t2;
  int t1;
  int t0;
  int is;
  int ik;
  int l;
  int k;
  int j;
  int i;
  int ipph;
  int idij;
  float *c1_local;
  float *cc_local;
  int idl1_local;
  int l1_local;
  int ip_local;
  int ido_local;
  
  iVar1 = ip * ido;
  iVar2 = l1 * ido;
  fVar6 = dradbg::tpi / (float)ip;
  dVar8 = cos((double)fVar6);
  dVar9 = sin((double)fVar6);
  iVar3 = ido + -1 >> 1;
  iVar4 = ip + 1 >> 1;
  if (ido < l1) {
    t3 = 0;
    for (k = 0; k < ido; k = k + 1) {
      t4 = t3;
      t5 = t3;
      for (ik = 0; ik < l1; ik = ik + 1) {
        ch[t4] = cc[t5];
        t4 = ido + t4;
        t5 = iVar1 + t5;
      }
      t3 = t3 + 1;
    }
  }
  else {
    t3 = 0;
    t4 = 0;
    for (ik = 0; ik < l1; ik = ik + 1) {
      t5 = t3;
      t6 = t4;
      for (k = 0; k < ido; k = k + 1) {
        ch[t5] = cc[t6];
        t5 = t5 + 1;
        t6 = t6 + 1;
      }
      t3 = ido + t3;
      t4 = iVar1 + t4;
    }
  }
  t3 = 0;
  t4 = ip * iVar2;
  t7 = ido * 2;
  for (l = 1; l < iVar4; l = l + 1) {
    t3 = iVar2 + t3;
    t4 = t4 - iVar2;
    t8 = t7;
    t6 = t4;
    t5 = t3;
    for (ik = 0; ik < l1; ik = ik + 1) {
      ch[t5] = cc[t8 + -1] + cc[t8 + -1];
      ch[t6] = cc[t8] + cc[t8];
      t5 = ido + t5;
      t6 = ido + t6;
      t8 = iVar1 + t8;
    }
    t7 = ido * 2 + t7;
  }
  if (ido != 1) {
    if (iVar3 < l1) {
      t3 = 0;
      t4 = ip * iVar2;
      t9 = 0;
      for (l = 1; l < iVar4; l = l + 1) {
        t3 = iVar2 + t3;
        t4 = t4 - iVar2;
        t9 = ido * 2 + t9;
        t11 = t9;
        t10 = t9;
        t6 = t4;
        t5 = t3;
        for (k = 2; k < ido; k = k + 2) {
          t5 = t5 + 2;
          t6 = t6 + 2;
          t10 = t10 + 2;
          t11 = t11 + -2;
          ai1 = (float)t11;
          dc2 = (float)t10;
          t8 = t6;
          t7 = t5;
          for (ik = 0; ik < l1; ik = ik + 1) {
            ch[t7 + -1] = cc[(int)dc2 + -1] + cc[(int)ai1 + -1];
            ch[t8 + -1] = cc[(int)dc2 + -1] - cc[(int)ai1 + -1];
            ch[t7] = cc[(int)dc2] - cc[(int)ai1];
            ch[t8] = cc[(int)dc2] + cc[(int)ai1];
            t7 = ido + t7;
            t8 = ido + t8;
            dc2 = (float)(iVar1 + (int)dc2);
            ai1 = (float)(iVar1 + (int)ai1);
          }
        }
      }
    }
    else {
      t3 = 0;
      t4 = ip * iVar2;
      t9 = 0;
      for (l = 1; l < iVar4; l = l + 1) {
        t3 = iVar2 + t3;
        t4 = t4 - iVar2;
        t9 = ido * 2 + t9;
        t10 = t9;
        t6 = t4;
        t5 = t3;
        for (ik = 0; ik < l1; ik = ik + 1) {
          t7 = t5;
          t8 = t6;
          t11 = t10;
          dc2 = (float)t10;
          for (k = 2; k < ido; k = k + 2) {
            iVar5 = t11 + 2;
            fVar6 = (float)((int)dc2 + -2);
            ch[t7 + 1] = cc[t11 + 1] + cc[(int)dc2 + -3];
            ch[t8 + 1] = cc[t11 + 1] - cc[(int)dc2 + -3];
            ch[t7 + 2] = cc[iVar5] - cc[(int)fVar6];
            ch[t8 + 2] = cc[iVar5] + cc[(int)fVar6];
            dc2 = fVar6;
            t11 = iVar5;
            t8 = t8 + 2;
            t7 = t7 + 2;
          }
          t5 = ido + t5;
          t6 = ido + t6;
          t10 = iVar1 + t10;
        }
      }
    }
  }
  ds2 = 1.0;
  ar1 = 0.0;
  t3 = 0;
  t4 = ip * idl1;
  for (is = 1; is < iVar4; is = is + 1) {
    t3 = idl1 + t3;
    t4 = t4 - idl1;
    fVar6 = (float)dVar8 * ds2 + -((float)dVar9 * ar1);
    ar1 = (float)dVar8 * ar1 + (float)dVar9 * ds2;
    t8 = 0;
    t10 = (ip + -1) * idl1;
    t9 = idl1;
    t7 = t4;
    t6 = t3;
    for (t0 = 0; t0 < idl1; t0 = t0 + 1) {
      c2[t6] = fVar6 * ch2[t9] + ch2[t8];
      c2[t7] = ar1 * ch2[t10];
      t10 = t10 + 1;
      t9 = t9 + 1;
      t8 = t8 + 1;
      t7 = t7 + 1;
      t6 = t6 + 1;
    }
    t9 = ip * idl1 - idl1;
    nbd = (int)fVar6;
    ar2 = ar1;
    t8 = idl1;
    for (l = 2; l < iVar4; l = l + 1) {
      t8 = idl1 + t8;
      t9 = t9 - idl1;
      fVar7 = fVar6 * (float)nbd + -(ar1 * ar2);
      ar2 = fVar6 * ar2 + ar1 * (float)nbd;
      ai1 = (float)t9;
      dc2 = (float)t8;
      t7 = t4;
      t6 = t3;
      for (t0 = 0; t0 < idl1; t0 = t0 + 1) {
        c2[t6] = fVar7 * ch2[(int)dc2] + c2[t6];
        c2[t7] = ar2 * ch2[(int)ai1] + c2[t7];
        ai1 = (float)((int)ai1 + 1);
        dc2 = (float)((int)dc2 + 1);
        t7 = t7 + 1;
        t6 = t6 + 1;
      }
      nbd = (int)fVar7;
    }
    ds2 = fVar6;
  }
  t3 = 0;
  for (l = 1; l < iVar4; l = l + 1) {
    t3 = idl1 + t3;
    t4 = t3;
    for (t0 = 0; t0 < idl1; t0 = t0 + 1) {
      ch2[t0] = ch2[t4] + ch2[t0];
      t4 = t4 + 1;
    }
  }
  t3 = 0;
  t4 = ip * iVar2;
  for (l = 1; l < iVar4; l = l + 1) {
    t3 = iVar2 + t3;
    t4 = t4 - iVar2;
    t6 = t4;
    t5 = t3;
    for (ik = 0; ik < l1; ik = ik + 1) {
      ch[t5] = c1[t5] - c1[t6];
      ch[t6] = c1[t5] + c1[t6];
      t5 = ido + t5;
      t6 = ido + t6;
    }
  }
  if (ido != 1) {
    if (iVar3 < l1) {
      t3 = 0;
      t4 = ip * iVar2;
      for (l = 1; l < iVar4; l = l + 1) {
        t3 = iVar2 + t3;
        t4 = t4 - iVar2;
        t6 = t4;
        t5 = t3;
        for (k = 2; k < ido; k = k + 2) {
          t5 = t5 + 2;
          t6 = t6 + 2;
          t8 = t6;
          t7 = t5;
          for (ik = 0; ik < l1; ik = ik + 1) {
            ch[t7 + -1] = c1[t7 + -1] - c1[t8];
            ch[t8 + -1] = c1[t7 + -1] + c1[t8];
            ch[t7] = c1[t7] + c1[t8 + -1];
            ch[t8] = c1[t7] - c1[t8 + -1];
            t7 = ido + t7;
            t8 = ido + t8;
          }
        }
      }
    }
    else {
      t3 = 0;
      t4 = ip * iVar2;
      for (l = 1; l < iVar4; l = l + 1) {
        t3 = iVar2 + t3;
        t4 = t4 - iVar2;
        t6 = t4;
        t5 = t3;
        for (ik = 0; ik < l1; ik = ik + 1) {
          t7 = t5;
          t8 = t6;
          for (k = 2; k < ido; k = k + 2) {
            iVar1 = t7 + 2;
            iVar5 = t8 + 2;
            ch[t7 + 1] = c1[t7 + 1] - c1[iVar5];
            ch[t8 + 1] = c1[t7 + 1] + c1[iVar5];
            ch[iVar1] = c1[iVar1] + c1[t8 + 1];
            ch[iVar5] = c1[iVar1] - c1[t8 + 1];
            t8 = iVar5;
            t7 = iVar1;
          }
          t5 = ido + t5;
          t6 = ido + t6;
        }
      }
    }
  }
  if (ido != 1) {
    for (t0 = 0; t0 < idl1; t0 = t0 + 1) {
      c2[t0] = ch2[t0];
    }
    t3 = 0;
    for (l = 1; l < ip; l = l + 1) {
      t3 = iVar2 + t3;
      t4 = t3;
      for (ik = 0; ik < l1; ik = ik + 1) {
        c1[t4] = ch[t4];
        t4 = ido + t4;
      }
    }
    if (l1 < iVar3) {
      t1 = -1 - ido;
      t3 = 0;
      for (l = 1; l < ip; l = l + 1) {
        t1 = ido + t1;
        t3 = iVar2 + t3;
        t4 = t3;
        for (ik = 0; ik < l1; ik = ik + 1) {
          t5 = t4;
          i = t1;
          for (k = 2; k < ido; k = k + 2) {
            iVar1 = i + 2;
            iVar3 = t5 + 2;
            c1[t5 + 1] = wa[i + 1] * ch[t5 + 1] + -(wa[iVar1] * ch[iVar3]);
            c1[iVar3] = wa[i + 1] * ch[iVar3] + wa[iVar1] * ch[t5 + 1];
            t5 = iVar3;
            i = iVar1;
          }
          t4 = ido + t4;
        }
      }
    }
    else {
      t1 = -1 - ido;
      t3 = 0;
      for (l = 1; l < ip; l = l + 1) {
        t1 = ido + t1;
        t3 = iVar2 + t3;
        t4 = t3;
        i = t1;
        for (k = 2; k < ido; k = k + 2) {
          t4 = t4 + 2;
          iVar1 = i + 2;
          t5 = t4;
          for (ik = 0; ik < l1; ik = ik + 1) {
            c1[t5 + -1] = wa[i + 1] * ch[t5 + -1] + -(wa[iVar1] * ch[t5]);
            c1[t5] = wa[i + 1] * ch[t5] + wa[iVar1] * ch[t5 + -1];
            t5 = ido + t5;
          }
          i = iVar1;
        }
      }
    }
  }
  return;
}

Assistant:

static void dradbg(int ido,int ip,int l1,int idl1,float *cc,float *c1,
            float *c2,float *ch,float *ch2,float *wa){
  static float tpi=6.283185307179586f;
  int idij,ipph,i,j,k,l,ik,is,t0,t1,t2,t3,t4,t5,t6,t7,t8,t9,t10,
      t11,t12;
  float dc2,ai1,ai2,ar1,ar2,ds2;
  int nbd;
  float dcp,arg,dsp,ar1h,ar2h;
  int ipp2;

  t10=ip*ido;
  t0=l1*ido;
  arg=tpi/(float)ip;
  dcp=cos(arg);
  dsp=sin(arg);
  nbd=(ido-1)>>1;
  ipp2=ip;
  ipph=(ip+1)>>1;
  if(ido<l1)goto L103;

  t1=0;
  t2=0;
  for(k=0;k<l1;k++){
    t3=t1;
    t4=t2;
    for(i=0;i<ido;i++){
      ch[t3]=cc[t4];
      t3++;
      t4++;
    }
    t1+=ido;
    t2+=t10;
  }
  goto L106;

 L103:
  t1=0;
  for(i=0;i<ido;i++){
    t2=t1;
    t3=t1;
    for(k=0;k<l1;k++){
      ch[t2]=cc[t3];
      t2+=ido;
      t3+=t10;
    }
    t1++;
  }

 L106:
  t1=0;
  t2=ipp2*t0;
  t7=(t5=ido<<1);
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    t6=t5;
    for(k=0;k<l1;k++){
      ch[t3]=cc[t6-1]+cc[t6-1];
      ch[t4]=cc[t6]+cc[t6];
      t3+=ido;
      t4+=ido;
      t6+=t10;
    }
    t5+=t7;
  }

  if (ido == 1)goto L116;
  if(nbd<l1)goto L112;

  t1=0;
  t2=ipp2*t0;
  t7=0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;

    t7+=(ido<<1);
    t8=t7;
    for(k=0;k<l1;k++){
      t5=t3;
      t6=t4;
      t9=t8;
      t11=t8;
      for(i=2;i<ido;i+=2){
        t5+=2;
        t6+=2;
        t9+=2;
        t11-=2;
        ch[t5-1]=cc[t9-1]+cc[t11-1];
        ch[t6-1]=cc[t9-1]-cc[t11-1];
        ch[t5]=cc[t9]-cc[t11];
        ch[t6]=cc[t9]+cc[t11];
      }
      t3+=ido;
      t4+=ido;
      t8+=t10;
    }
  }
  goto L116;

 L112:
  t1=0;
  t2=ipp2*t0;
  t7=0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    t7+=(ido<<1);
    t8=t7;
    t9=t7;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4+=2;
      t8+=2;
      t9-=2;
      t5=t3;
      t6=t4;
      t11=t8;
      t12=t9;
      for(k=0;k<l1;k++){
        ch[t5-1]=cc[t11-1]+cc[t12-1];
        ch[t6-1]=cc[t11-1]-cc[t12-1];
        ch[t5]=cc[t11]-cc[t12];
        ch[t6]=cc[t11]+cc[t12];
        t5+=ido;
        t6+=ido;
        t11+=t10;
        t12+=t10;
      }
    }
  }

L116:
  ar1=1.f;
  ai1=0.f;
  t1=0;
  t9=(t2=ipp2*idl1);
  t3=(ip-1)*idl1;
  for(l=1;l<ipph;l++){
    t1+=idl1;
    t2-=idl1;

    ar1h=dcp*ar1-dsp*ai1;
    ai1=dcp*ai1+dsp*ar1;
    ar1=ar1h;
    t4=t1;
    t5=t2;
    t6=0;
    t7=idl1;
    t8=t3;
    for(ik=0;ik<idl1;ik++){
      c2[t4++]=ch2[t6++]+ar1*ch2[t7++];
      c2[t5++]=ai1*ch2[t8++];
    }
    dc2=ar1;
    ds2=ai1;
    ar2=ar1;
    ai2=ai1;

    t6=idl1;
    t7=t9-idl1;
    for(j=2;j<ipph;j++){
      t6+=idl1;
      t7-=idl1;
      ar2h=dc2*ar2-ds2*ai2;
      ai2=dc2*ai2+ds2*ar2;
      ar2=ar2h;
      t4=t1;
      t5=t2;
      t11=t6;
      t12=t7;
      for(ik=0;ik<idl1;ik++){
        c2[t4++]+=ar2*ch2[t11++];
        c2[t5++]+=ai2*ch2[t12++];
      }
    }
  }

  t1=0;
  for(j=1;j<ipph;j++){
    t1+=idl1;
    t2=t1;
    for(ik=0;ik<idl1;ik++)ch2[ik]+=ch2[t2++];
  }

  t1=0;
  t2=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    for(k=0;k<l1;k++){
      ch[t3]=c1[t3]-c1[t4];
      ch[t4]=c1[t3]+c1[t4];
      t3+=ido;
      t4+=ido;
    }
  }

  if(ido==1)goto L132;
  if(nbd<l1)goto L128;

  t1=0;
  t2=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    for(k=0;k<l1;k++){
      t5=t3;
      t6=t4;
      for(i=2;i<ido;i+=2){
        t5+=2;
        t6+=2;
        ch[t5-1]=c1[t5-1]-c1[t6];
        ch[t6-1]=c1[t5-1]+c1[t6];
        ch[t5]=c1[t5]+c1[t6-1];
        ch[t6]=c1[t5]-c1[t6-1];
      }
      t3+=ido;
      t4+=ido;
    }
  }
  goto L132;

 L128:
  t1=0;
  t2=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4+=2;
      t5=t3;
      t6=t4;
      for(k=0;k<l1;k++){
        ch[t5-1]=c1[t5-1]-c1[t6];
        ch[t6-1]=c1[t5-1]+c1[t6];
        ch[t5]=c1[t5]+c1[t6-1];
        ch[t6]=c1[t5]-c1[t6-1];
        t5+=ido;
        t6+=ido;
      }
    }
  }

L132:
  if(ido==1)return;

  for(ik=0;ik<idl1;ik++)c2[ik]=ch2[ik];

  t1=0;
  for(j=1;j<ip;j++){
    t2=(t1+=t0);
    for(k=0;k<l1;k++){
      c1[t2]=ch[t2];
      t2+=ido;
    }
  }

  if(nbd>l1)goto L139;

  is= -ido-1;
  t1=0;
  for(j=1;j<ip;j++){
    is+=ido;
    t1+=t0;
    idij=is;
    t2=t1;
    for(i=2;i<ido;i+=2){
      t2+=2;
      idij+=2;
      t3=t2;
      for(k=0;k<l1;k++){
        c1[t3-1]=wa[idij-1]*ch[t3-1]-wa[idij]*ch[t3];
        c1[t3]=wa[idij-1]*ch[t3]+wa[idij]*ch[t3-1];
        t3+=ido;
      }
    }
  }
  return;

 L139:
  is= -ido-1;
  t1=0;
  for(j=1;j<ip;j++){
    is+=ido;
    t1+=t0;
    t2=t1;
    for(k=0;k<l1;k++){
      idij=is;
      t3=t2;
      for(i=2;i<ido;i+=2){
        idij+=2;
        t3+=2;
        c1[t3-1]=wa[idij-1]*ch[t3-1]-wa[idij]*ch[t3];
        c1[t3]=wa[idij-1]*ch[t3]+wa[idij]*ch[t3-1];
      }
      t2+=ido;
    }
  }
}